

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void CreateBinaryTree(void)

{
  size_t __nmemb;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  vocab_word *pvVar1;
  long lVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  longlong lVar7;
  long lVar8;
  long lVar9;
  longlong lVar10;
  bool bVar11;
  char code [40];
  longlong point [40];
  
  lVar10 = vocab_size;
  lVar5 = vocab_size * 2;
  __nmemb = vocab_size * 2 + 1;
  __ptr = calloc(__nmemb,8);
  __ptr_00 = calloc(__nmemb,8);
  __ptr_01 = calloc(__nmemb,8);
  lVar3 = 0;
  pvVar1 = vocab;
  lVar2 = 0;
  if (0 < lVar10) {
    lVar2 = lVar10;
  }
  for (; lVar4 = lVar10, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *(longint *)((long)__ptr + lVar3 * 8) = pvVar1->cn;
    pvVar1 = pvVar1 + 1;
  }
  for (; SBORROW8(lVar4,lVar5) != lVar4 + lVar10 * -2 < 0; lVar4 = lVar4 + 1) {
    *(undefined8 *)((long)__ptr + lVar4 * 8) = 1000000000000000;
  }
  lVar5 = lVar10 + -1;
  lVar2 = 0;
  if (0 < lVar5) {
    lVar2 = lVar5;
  }
  lVar7 = lVar10;
  do {
    bVar11 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar11) {
      __stream = fopen(output_classifier,"wb");
      for (lVar5 = 0; lVar5 < vocab_size * 2 + -2; lVar5 = lVar5 + 1) {
        if (binary == 0) {
          fprintf(__stream,"%lld %lld %lld\n",lVar5,*(undefined8 *)((long)__ptr_01 + lVar5 * 8),
                  *(undefined8 *)((long)__ptr_00 + lVar5 * 8));
        }
        else {
          point[0] = (*(long *)((long)__ptr_00 + lVar5 * 8) * 2 + -1) *
                     *(long *)((long)__ptr_01 + lVar5 * 8);
          fwrite(point,8,1,__stream);
        }
      }
      fclose(__stream);
      lVar10 = vocab_size;
      for (lVar5 = 0; pvVar1 = vocab, lVar5 < lVar10; lVar5 = lVar5 + 1) {
        lVar2 = lVar5;
        lVar3 = 0;
        lVar4 = 1;
        do {
          lVar9 = lVar4;
          lVar6 = lVar3;
          code[lVar6] = *(char *)((long)__ptr_00 + lVar2 * 8);
          point[lVar6] = lVar2;
          lVar2 = *(long *)((long)__ptr_01 + lVar2 * 8);
          lVar3 = lVar6 + 1;
          lVar4 = lVar9 + 1;
        } while (lVar2 != lVar10 * 2 + -2);
        vocab[lVar5].codelen = (int8_t)(lVar6 + 1);
        *pvVar1[lVar5].point = (int)lVar10 + -2;
        lVar2 = 0;
        for (; lVar6 != -1; lVar6 = lVar6 + -1) {
          pvVar1[lVar5].code[lVar9 + -1] = code[lVar2];
          pvVar1 = vocab;
          lVar10 = vocab_size;
          vocab[lVar5].point[lVar9] = (int)point[lVar2] - (int)vocab_size;
          lVar2 = lVar2 + 1;
          lVar9 = lVar9 + -1;
        }
      }
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
      return;
    }
    if (lVar5 < 0) {
      lVar3 = lVar7 + 1;
LAB_00102a59:
      lVar8 = lVar3 + 1;
    }
    else {
      lVar6 = *(long *)((long)__ptr + lVar5 * 8);
      lVar4 = *(long *)((long)__ptr + lVar7 * 8);
      if (lVar6 < lVar4) {
        if (lVar5 == 0) {
          lVar5 = -1;
          lVar3 = lVar7;
          lVar7 = 0;
          goto LAB_00102a59;
        }
        lVar6 = *(long *)((long)__ptr + lVar5 * 8 + -8);
        lVar9 = lVar5 + -1;
        lVar8 = lVar7;
        lVar7 = lVar5;
      }
      else {
        lVar4 = *(long *)((long)__ptr + lVar7 * 8 + 8);
        lVar8 = lVar7 + 1;
        lVar9 = lVar5;
      }
      lVar5 = lVar9;
      lVar3 = lVar8;
      if (lVar4 <= lVar6) goto LAB_00102a59;
      lVar5 = lVar9 + -1;
      lVar3 = lVar9;
    }
    *(long *)((long)__ptr + lVar10 * 8) =
         *(long *)((long)__ptr + lVar3 * 8) + *(long *)((long)__ptr + lVar7 * 8);
    *(longlong *)((long)__ptr_01 + lVar7 * 8) = lVar10;
    *(longlong *)((long)__ptr_01 + lVar3 * 8) = lVar10;
    *(undefined8 *)((long)__ptr_00 + lVar3 * 8) = 1;
    lVar10 = lVar10 + 1;
    lVar7 = lVar8;
  } while( true );
}

Assistant:

void CreateBinaryTree() {
  long long a, b, i, min1i, min2i, pos1, pos2, point[MAX_CODE_LENGTH];
  char code[MAX_CODE_LENGTH];
  long long *count = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *binary_side = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *parent_node = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  for (a = 0; a < vocab_size; a++) count[a] = vocab[a].cn;
  for (a = vocab_size; a < vocab_size * 2; a++) count[a] = 1e15;
  pos1 = vocab_size - 1;
  pos2 = vocab_size;
  // Following algorithm constructs the Huffman tree by adding one node at a time
  for (a = 0; a < vocab_size - 1; a++) {
    // First, find two smallest nodes 'min1, min2'
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min1i = pos1;
        pos1--;
      } else {
        min1i = pos2;
        pos2++;
      }
    } else {
      min1i = pos2;
      pos2++;
    }
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min2i = pos1;
        pos1--;
      } else {
        min2i = pos2;
        pos2++;
      }
    } else {
      min2i = pos2;
      pos2++;
    }
    count[vocab_size + a] = count[min1i] + count[min2i];
    parent_node[min1i] = vocab_size + a;
    parent_node[min2i] = vocab_size + a;
    binary_side[min2i] = 1;
  }
  // Outputs the tree if requested
  if (output_classifier) {
    FILE * file = fopen(output_classifier, "wb");
    // The root is not written (node vocab_size * 2 - 2)
    for (b = 0; b < vocab_size * 2 - 2; b++) {
      if (binary) {
        // In binary mode, just write the parent * sign
        // where sign is +1 or -1, depending on which child is used
        longint d = (2 * binary_side[b] - 1) * parent_node[b];
        fwrite(&d, sizeof(longint), 1,  file);
      } else fprintf(file, "%lld %lld %lld\n", b, parent_node[b], binary_side[b]);
    }
    fclose(file);
  }

  // Now assign binary_side code to each vocabulary word
  for (a = 0; a < vocab_size; a++) {
    b = a;
    i = 0;
    while (1) {
      code[i] = binary_side[b];
      point[i] = b;
      i++;
      b = parent_node[b];
      if (b == vocab_size * 2 - 2) break;
    }
    vocab[a].codelen = i;
    vocab[a].point[0] = vocab_size - 2;
    for (b = 0; b < i; b++) {
      vocab[a].code[i - b - 1] = code[b];
      vocab[a].point[i - b] = point[b] - vocab_size;
    }
  }
  free(count);
  free(binary_side);
  free(parent_node);
}